

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int cuddEstimateCofactor(DdManager *dd,st__table *table,DdNode *node,int i,int phase,DdNode **ptr)

{
  uint uVar1;
  DdNode *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  bool bVar8;
  DdNode *ptrT;
  DdNode *ptrE;
  DdNode *local_40;
  DdNode *local_38;
  
  if (((ulong)node->next & 1) != 0) {
    iVar3 = st__lookup(table,(char *)node,(char **)ptr);
    if (iVar3 != 0) {
      return 0;
    }
    iVar3 = st__add_direct(table,(char *)node,(char *)node);
    if (iVar3 != -10000) {
      *ptr = node;
      return 0;
    }
    return -1;
  }
  node->next = (DdNode *)((ulong)node->next | 1);
  uVar1 = node->index;
  if ((ulong)uVar1 == 0x7fffffff) {
    *ptr = node;
    iVar3 = st__add_direct(table,(char *)node,(char *)node);
    return (uint)(iVar3 != -10000) * 2 + -1;
  }
  if (uVar1 == i) {
    if (phase == 1) {
      *ptr = (DdNode *)(node->type).value;
      pDVar7 = (node->type).kids.T;
    }
    else {
      *ptr = (node->type).kids.E;
      pDVar7 = (DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe);
    }
    iVar3 = ddDagInt(pDVar7);
    if ((1 < node->ref) &&
       (iVar5 = st__add_direct(table,(char *)node,(char *)*ptr), iVar5 == -10000)) {
      return -1;
    }
    return iVar3;
  }
  if (dd->perm[i] < dd->perm[uVar1]) {
    *ptr = node;
    iVar3 = ddDagInt((node->type).kids.T);
    iVar5 = ddDagInt((DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe));
    if ((1 < node->ref) &&
       (iVar4 = st__add_direct(table,(char *)node,(char *)node), iVar4 == -10000)) {
      return -1;
    }
    return iVar3 + iVar5 + 1;
  }
  iVar3 = cuddEstimateCofactor(dd,table,(node->type).kids.T,i,phase,&local_40);
  iVar5 = cuddEstimateCofactor
                    (dd,table,(DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe),i,phase,
                     &local_38);
  pDVar7 = (node->type).kids.E;
  pDVar6 = (DdNode *)((ulong)((uint)pDVar7 & 1) ^ (ulong)local_38);
  if (local_40 == pDVar6) {
    *ptr = local_40;
    if (node->ref < 2) {
      return iVar3;
    }
    local_38 = pDVar6;
    iVar5 = st__add_direct(table,(char *)node,(char *)local_40);
joined_r0x0079a325:
    if (iVar5 == -10000) {
      return -1;
    }
  }
  else {
    if ((pDVar7 != pDVar6) || (local_40 != (node->type).kids.T)) {
      if ((int)node->index < dd->size) {
        for (pDVar7 = dd->subtables[(uint)dd->perm[(int)node->index]].nodelist
                      [(int)((((uint)pDVar6 & 1) +
                              *(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 0x20) * 2 +
                             (((uint)local_40 & 1) +
                             *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005
                             ) * 0x40f1f9 >>
                            ((byte)dd->subtables[(uint)dd->perm[(int)node->index]].shift & 0x1f))];
            local_40 < (pDVar7->type).kids.T;
            pDVar7 = (DdNode *)((ulong)pDVar7->next & 0xfffffffffffffffe)) {
        }
        for (; bVar8 = (pDVar7->type).kids.T == local_40, bVar8;
            pDVar7 = (DdNode *)((ulong)pDVar7->next & 0xfffffffffffffffe)) {
          pDVar2 = (pDVar7->type).kids.E;
          if (pDVar2 <= pDVar6) {
            if ((bVar8) && (pDVar2 == pDVar6)) goto LAB_0079a2b1;
            break;
          }
        }
      }
      pDVar7 = (DdNode *)0x0;
LAB_0079a2b1:
      *ptr = pDVar7;
      if (pDVar7 != (DdNode *)0x0) {
        iVar3 = iVar3 + 1 + iVar5;
        if (((ulong)pDVar7->next & 1) != 0) {
          iVar3 = 0;
        }
        if (node->ref < 2) {
          return iVar3;
        }
        local_38 = pDVar6;
        iVar5 = st__add_direct(table,(char *)node,(char *)pDVar7);
        goto joined_r0x0079a325;
      }
    }
    *ptr = node;
    iVar3 = iVar3 + iVar5 + 1;
  }
  return iVar3;
}

Assistant:

static int
cuddEstimateCofactor(
  DdManager *dd,
  st__table *table,
  DdNode * node,
  int i,
  int phase,
  DdNode ** ptr)
{
    int tval, eval, val;
    DdNode *ptrT, *ptrE;

    if (Cudd_IsComplement(node->next)) {
        if (! st__lookup(table,(char *)node,(char **)ptr)) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
            *ptr = node;
        }
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        *ptr = node;
        if ( st__add_direct(table,(char *)node,(char *)node) == st__OUT_OF_MEM)
            return(CUDD_OUT_OF_MEM);
        return(1);
    }
    if ((int) node->index == i) {
        if (phase == 1) {
            *ptr = cuddT(node);
            val = ddDagInt(cuddT(node));
        } else {
            *ptr = cuddE(node);
            val = ddDagInt(Cudd_Regular(cuddE(node)));
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        return(val);
    }
    if (dd->perm[node->index] > dd->perm[i]) {
        *ptr = node;
        tval = ddDagInt(cuddT(node));
        eval = ddDagInt(Cudd_Regular(cuddE(node)));
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        val = 1 + tval + eval;
        return(val);
    }
    tval = cuddEstimateCofactor(dd,table,cuddT(node),i,phase,&ptrT);
    eval = cuddEstimateCofactor(dd,table,Cudd_Regular(cuddE(node)),i,
                                phase,&ptrE);
    ptrE = Cudd_NotCond(ptrE,Cudd_IsComplement(cuddE(node)));
    if (ptrT == ptrE) {         /* recombination */
        *ptr = ptrT;
        val = tval;
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else if ((ptrT != cuddT(node) || ptrE != cuddE(node)) &&
               (*ptr = cuddUniqueLookup(dd,node->index,ptrT,ptrE)) != NULL) {
        if (Cudd_IsComplement((*ptr)->next)) {
            val = 0;
        } else {
            val = 1 + tval + eval;
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else {
        *ptr = node;
        val = 1 + tval + eval;
    }
    return(val);

}